

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenUnionGenericTypeTS_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,EnumDef *union_enum)

{
  bool bVar1;
  char *__rhs;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  EnumDef *local_20;
  EnumDef *union_enum_local;
  TsGenerator *this_local;
  
  local_20 = union_enum;
  union_enum_local = (EnumDef *)this;
  this_local = (TsGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"any",&local_41);
  bVar1 = UnionHasStringType(this,local_20);
  __rhs = "";
  if (bVar1) {
    __rhs = "|string";
  }
  std::operator+(__return_storage_ptr__,&local_40,__rhs);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnionGenericTypeTS(const EnumDef &union_enum) {
    // TODO: make it work without any
    // return std::string("T") + (UnionHasStringType(union_enum) ? "|string" :
    // "");
    return std::string("any") +
           (UnionHasStringType(union_enum) ? "|string" : "");
  }